

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_oh_new_binary_string(qpdf_data qpdf,char *str,size_t length)

{
  qpdf_oh qVar1;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  undefined1 local_20 [16];
  
  local_30._M_allocated_capacity = (size_type)local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_40 + 0x10),str,str + length);
  QPDFObjectHandle::newString((string *)local_40);
  qVar1 = new_object(qpdf,(QPDFObjectHandle *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_binary_string(qpdf_data qpdf, char const* str, size_t length)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_binary_string");
    return new_object(qpdf, QPDFObjectHandle::newString(std::string(str, length)));
}